

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void * filemgr_get_header(filemgr *file,void *buf,size_t *len,bid_t *header_bid,fdb_seqnum_t *seqnum
                         ,filemgr_header_revnum_t *header_revnum)

{
  bid_t bVar1;
  __int_type_conflict _Var2;
  bid_t *in_RCX;
  ulong *in_RDX;
  void *in_RSI;
  long in_RDI;
  __atomic_base<unsigned_long> *in_R8;
  filemgr *in_R9;
  void *local_10;
  
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  local_10 = in_RSI;
  if (*(short *)(in_RDI + 0x50) != 0) {
    if (in_RSI == (void *)0x0) {
      local_10 = malloc((ulong)*(ushort *)(in_RDI + 0x50));
    }
    memcpy(local_10,*(void **)(in_RDI + 0xe0),(ulong)*(ushort *)(in_RDI + 0x50));
  }
  if (in_RDX != (ulong *)0x0) {
    *in_RDX = (ulong)*(ushort *)(in_RDI + 0x50);
  }
  if (in_RCX != (bid_t *)0x0) {
    bVar1 = filemgr_get_header_bid(in_R9);
    *in_RCX = bVar1;
  }
  if (in_R8 != (__atomic_base<unsigned_long> *)0x0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long(in_R8);
    in_R8->_M_i = _Var2;
  }
  if (in_R9 != (filemgr *)0x0) {
    in_R9->filename = *(char **)(in_RDI + 0x58);
  }
  pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  return local_10;
}

Assistant:

void* filemgr_get_header(struct filemgr *file, void *buf, size_t *len,
                         bid_t *header_bid, fdb_seqnum_t *seqnum,
                         filemgr_header_revnum_t *header_revnum)
{
    spin_lock(&file->lock);

    if (file->header.size > 0) {
        if (buf == NULL) {
            buf = (void*)malloc(file->header.size);
        }
        memcpy(buf, file->header.data, file->header.size);
    }

    if (len) {
        *len = file->header.size;
    }
    if (header_bid) {
        *header_bid = filemgr_get_header_bid(file);
    }
    if (seqnum) {
        *seqnum = file->header.seqnum;
    }
    if (header_revnum) {
        *header_revnum = file->header.revnum;
    }

    spin_unlock(&file->lock);

    return buf;
}